

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgztexture.cpp
# Opt level: O2

FTexture * IMGZTexture_TryCreate(FileReader *file,int lumpnum)

{
  int iVar1;
  undefined4 extraout_var;
  FIMGZTexture *this;
  WORD w;
  DWORD magic;
  SWORD t;
  SWORD l;
  WORD h;
  
  magic = 0;
  this = (FIMGZTexture *)0x0;
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  iVar1 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&magic,4);
  if ((CONCAT44(extraout_var,iVar1) == 4) && (magic == 0x5a474d49)) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&w,2);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&h,2);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&l,2);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&t,2);
    this = (FIMGZTexture *)operator_new(0xa8);
    FIMGZTexture::FIMGZTexture(this,lumpnum,w,h,l,t);
  }
  return &this->super_FTexture;
}

Assistant:

FTexture *IMGZTexture_TryCreate(FileReader & file, int lumpnum)
{
	DWORD magic = 0;
	WORD w, h;
	SWORD l, t;

	file.Seek(0, SEEK_SET);
	if (file.Read(&magic, 4) != 4) return NULL;
	if (magic != MAKE_ID('I','M','G','Z')) return NULL;
	file >> w >> h >> l >> t;
	return new FIMGZTexture(lumpnum, w, h, l, t);
}